

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O1

void __thiscall Map::Continent::Continent(Continent *this,Continent *toCopy)

{
  string *psVar1;
  int *piVar2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar3;
  
  psVar1 = (string *)operator_new(0x20);
  (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
  psVar1->_M_string_length = 0;
  (psVar1->field_2)._M_local_buf[0] = '\0';
  this->pCName = psVar1;
  piVar2 = (int *)operator_new(4);
  *piVar2 = 0;
  this->pCTroops = piVar2;
  pvVar3 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->pCountriesInContinent = pvVar3;
  std::__cxx11::string::_M_assign((string *)psVar1);
  *this->pCTroops = *toCopy->pCTroops;
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::operator=
            (this->pCountriesInContinent,toCopy->pCountriesInContinent);
  return;
}

Assistant:

Map::Continent::Continent(Map::Continent &toCopy) {
    pCName = new string();
    pCTroops = new int();
    pCountriesInContinent = new vector<Country*>;
    *pCName = *toCopy.pCName;
    *pCTroops = *toCopy.pCTroops;
    *pCountriesInContinent = *toCopy.pCountriesInContinent;
}